

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_compression_type(fitsfile *fptr,int ctype,int *status)

{
  int *status_local;
  int ctype_local;
  fitsfile *fptr_local;
  
  if (((((ctype == 0xb) || (ctype == 0x15)) || (ctype == 0x16)) ||
      ((ctype == 0x1f || (ctype == 0x29)))) || ((ctype == 0x33 || ((ctype == -1 || (ctype == 0))))))
  {
    fptr->Fptr->request_compress_type = ctype;
  }
  else {
    ffpmsg("unknown compression algorithm (fits_set_compression_type)");
    *status = 0x19d;
  }
  return *status;
}

Assistant:

int fits_set_compression_type(fitsfile *fptr,  /* I - FITS file pointer     */
       int ctype,    /* image compression type code;                        */
                     /* allowed values: RICE_1, GZIP_1, GZIP_2, PLIO_1,     */
                     /*  HCOMPRESS_1, BZIP2_1, and NOCOMPRESS               */
       int *status)  /* IO - error status                                   */
{
/*
   This routine specifies the image compression algorithm that should be
   used when writing a FITS image.  The image is divided into tiles, and
   each tile is compressed and stored in a row of at variable length binary
   table column.
*/

    if (ctype != RICE_1 && 
        ctype != GZIP_1 && 
        ctype != GZIP_2 && 
        ctype != PLIO_1 && 
        ctype != HCOMPRESS_1 && 
        ctype != BZIP2_1 && 
        ctype != NOCOMPRESS &&
	ctype != 0)
    {
	ffpmsg("unknown compression algorithm (fits_set_compression_type)");
	*status = DATA_COMPRESSION_ERR; 
    } else {
        (fptr->Fptr)->request_compress_type = ctype;
    }
    return(*status);
}